

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ObjectField *
jsonnet::internal::ObjectField::Local
          (Fodder *fodder1,Fodder *fodder2,Fodder *fodder_l,Fodder *fodder_r,bool method_sugar,
          Identifier *id,ArgParams *params,bool trailing_comma,Fodder *op_fodder,AST *body,
          Fodder *comma_fodder)

{
  Kind kind;
  Hide in_ECX;
  undefined8 in_RDX;
  Fodder *in_RSI;
  ObjectField *in_RDI;
  byte in_R9B;
  Fodder *in_stack_00000008;
  LocationRange *in_stack_fffffffffffffea0;
  Fodder *fodder2_00;
  ObjectField *this;
  AST *in_stack_ffffffffffffff58;
  Identifier *in_stack_ffffffffffffff60;
  LocationRange *in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  Fodder *in_stack_ffffffffffffff80;
  AST *in_stack_ffffffffffffff88;
  AST *in_stack_ffffffffffffff90;
  Fodder *in_stack_ffffffffffffff98;
  
  kind = (Kind)(in_R9B & 1);
  fodder2_00 = (Fodder *)&stack0xffffffffffffff68;
  this = in_RDI;
  LocationRange::LocationRange(in_stack_fffffffffffffea0);
  ObjectField(this,kind,in_stack_00000008,fodder2_00,(Fodder *)in_RDI,in_RSI,in_ECX,
              SUB81((ulong)in_RDX >> 0x38,0),SUB81((ulong)in_RDX >> 0x30,0),
              in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
              (ArgParams *)in_stack_ffffffffffffff70,SUB81((ulong)in_RDX >> 0x28,0),
              in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
              in_stack_ffffffffffffff98);
  LocationRange::~LocationRange((LocationRange *)0x219078);
  return in_RDI;
}

Assistant:

static ObjectField Local(const Fodder &fodder1, const Fodder &fodder2, const Fodder &fodder_l,
                             const Fodder &fodder_r, bool method_sugar, const Identifier *id,
                             const ArgParams &params, bool trailing_comma, const Fodder &op_fodder,
                             AST *body, const Fodder &comma_fodder)
    {
        return ObjectField(LOCAL,
                           fodder1,
                           fodder2,
                           fodder_l,
                           fodder_r,
                           VISIBLE,
                           false,
                           method_sugar,
                           nullptr,
                           id,
                           LocationRange(),
                           params,
                           trailing_comma,
                           op_fodder,
                           body,
                           nullptr,
                           comma_fodder);
    }